

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

NullableValue<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>_> *
__thiscall
kj::_::
NullableValue<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>::
operator=(NullableValue<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
          *this,NullableValue<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
                *other)

{
  PipelineOp *pPVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  PipelineHook *pPVar4;
  Disposer *pDVar5;
  PromiseArenaMember *node;
  
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      pPVar1 = (this->field_1).value.super_Pipeline._typeless.ops.ptr;
      if (pPVar1 != (PipelineOp *)0x0) {
        sVar2 = (this->field_1).value.super_Pipeline._typeless.ops.size_;
        (this->field_1).value.super_Pipeline._typeless.ops.ptr = (PipelineOp *)0x0;
        (this->field_1).value.super_Pipeline._typeless.ops.size_ = 0;
        pAVar3 = (this->field_1).value.super_Pipeline._typeless.ops.disposer;
        (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pPVar1,8,sVar2,sVar2,0);
      }
      pPVar4 = (this->field_1).value.super_Pipeline._typeless.hook.ptr;
      if (pPVar4 != (PipelineHook *)0x0) {
        (this->field_1).value.super_Pipeline._typeless.hook.ptr = (PipelineHook *)0x0;
        pDVar5 = (this->field_1).value.super_Pipeline._typeless.hook.disposer;
        (**pDVar5->_vptr_Disposer)
                  (pDVar5,pPVar4->_vptr_PipelineHook[-2] + (long)&pPVar4->_vptr_PipelineHook);
      }
      node = &((this->field_1).value.
               super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
               .super_PromiseBase.node.ptr)->super_PromiseArenaMember;
      if (node != (PromiseArenaMember *)0x0) {
        (this->field_1).value.
        super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
        super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        PromiseDisposer::dispose(node);
      }
    }
    if (other->isSet == true) {
      (this->field_1).value.
      super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
      super_PromiseBase.node.ptr =
           (other->field_1).value.
           super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
           .super_PromiseBase.node.ptr;
      (other->field_1).value.
      super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
      super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (this->field_1).value.super_Pipeline._typeless.hook.disposer =
           (other->field_1).value.super_Pipeline._typeless.hook.disposer;
      (this->field_1).value.super_Pipeline._typeless.hook.ptr =
           (other->field_1).value.super_Pipeline._typeless.hook.ptr;
      (other->field_1).value.super_Pipeline._typeless.hook.ptr = (PipelineHook *)0x0;
      (this->field_1).value.super_Pipeline._typeless.ops.ptr =
           (other->field_1).value.super_Pipeline._typeless.ops.ptr;
      (this->field_1).value.super_Pipeline._typeless.ops.size_ =
           (other->field_1).value.super_Pipeline._typeless.ops.size_;
      (this->field_1).value.super_Pipeline._typeless.ops.disposer =
           (other->field_1).value.super_Pipeline._typeless.ops.disposer;
      (other->field_1).value.super_Pipeline._typeless.ops.ptr = (PipelineOp *)0x0;
      (other->field_1).value.super_Pipeline._typeless.ops.size_ = 0;
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }